

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

OP1aHeader * __thiscall
ASDCP::MXF::OP1aHeader::InitFromPartitionBuffer(OP1aHeader *this,byte_t *p,ui32_t l)

{
  int iVar1;
  ui64_t uVar2;
  int in_ECX;
  undefined4 in_register_00000014;
  Result_t local_110 [108];
  int local_a4;
  undefined1 local_a0 [4];
  ui32_t pp_len;
  undefined1 local_25;
  int local_24;
  long lStack_20;
  ui32_t l_local;
  byte_t *p_local;
  OP1aHeader *this_local;
  Result_t *result;
  
  lStack_20 = CONCAT44(in_register_00000014,l);
  local_25 = 0;
  local_24 = in_ECX;
  p_local = p;
  this_local = this;
  KLVPacket::InitFromBuffer((KLVPacket *)this,p,l);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    Partition::InitFromBuffer((Partition *)local_a0,p,(ui32_t)*(undefined8 *)(p + 0x18));
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_a0);
    Kumu::Result_t::~Result_t((Result_t *)local_a0);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    uVar2 = KLVPacket::PacketLength((KLVPacket *)p);
    local_a4 = (int)uVar2;
    (**(code **)(*(long *)p + 0x28))
              (local_110,p,lStack_20 + (uVar2 & 0xffffffff),local_24 - local_a4);
    Kumu::Result_t::operator=((Result_t *)this,local_110);
    Kumu::Result_t::~Result_t(local_110);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OP1aHeader::InitFromPartitionBuffer(const byte_t* p, ui32_t l)
{
  Result_t result = KLVPacket::InitFromBuffer(p, l);

  if ( ASDCP_SUCCESS(result) )
    result = Partition::InitFromBuffer(m_ValueStart, m_ValueLength); // test UL and OP

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t pp_len = KLVPacket::PacketLength();
      result = InitFromBuffer(p + pp_len, l - pp_len);
    }

  return result;
}